

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_import::statement_import
          (statement_import *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
          *var_list,context_t *c,token_base *ptr)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  *in_RDX;
  context_t *in_RSI;
  token_base *in_RDI;
  statement_base *in_stack_ffffffffffffffd0;
  
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_RDI,(shared_ptr<cs::context_type> *)in_RDX);
  statement_base::statement_base(in_stack_ffffffffffffffd0,in_RSI,in_RDI);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x24168a);
  in_RDI->_vptr_token_base = (_func_int **)&PTR__statement_import_003be130;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
            *)in_RDI,in_RDX);
  return;
}

Assistant:

statement_import(std::vector<std::pair<std::string, var>> var_list, context_t c, token_base *ptr)
			: statement_base(std::move(c), ptr), m_var_list(std::move(var_list)) {}